

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

uint32_t helper_bcdcfz_ppc64(ppc_avr_t *r,ppc_avr_t *b,uint32_t ps)

{
  uint uVar1;
  int local_54;
  undefined1 auStack_48 [4];
  int sgnb;
  ppc_avr_t ret;
  int local_30;
  int digit;
  int zone_lead;
  int zone_digit;
  int invalid;
  int cr;
  int i;
  uint32_t ps_local;
  ppc_avr_t *b_local;
  ppc_avr_t *r_local;
  
  zone_digit = 0;
  zone_lead = 0;
  digit = 0;
  local_30 = 3;
  if (ps != 0) {
    local_30 = 0xf;
  }
  ret.u32[3] = 0;
  cr = ps;
  _i = b;
  b_local = r;
  memset(auStack_48,0,0x10);
  uVar1 = (int)(uint)_i->u8[0] >> 4;
  if (uVar1 < 10 && cr != 0) {
    zone_lead = 1;
  }
  invalid = 0;
  do {
    if (0xf < invalid) {
LAB_010242fa:
      if (((cr == 0) || ((uVar1 != 0xb && (uVar1 != 0xd)))) && ((cr != 0 || ((uVar1 & 4) == 0)))) {
        bcd_put_digit((ppc_avr_t *)auStack_48,'\f',0);
      }
      else {
        bcd_put_digit((ppc_avr_t *)auStack_48,'\r',0);
      }
      zone_digit = bcd_cmp_zero((ppc_avr_t *)auStack_48);
      if (zone_lead != 0) {
        zone_digit = 1;
      }
      b_local->u64[0] = _auStack_48;
      b_local->u64[1] = ret.u64[0];
      return zone_digit;
    }
    if (invalid == 0) {
      local_54 = local_30;
    }
    else {
      local_54 = (int)(uint)_i->u8[0xf - (0xf - (invalid << 1) / 2)] >> 4;
    }
    digit = local_54;
    ret.u32[3] = _i->u8[0xf - (0xf - (invalid << 1) / 2)] & 0xf;
    if (local_54 != local_30 || 9 < ret.u32[3]) {
      zone_lead = 1;
      goto LAB_010242fa;
    }
    bcd_put_digit((ppc_avr_t *)auStack_48,(uint8_t)ret.u32[3],invalid + 1);
    invalid = invalid + 1;
  } while( true );
}

Assistant:

uint32_t helper_bcdcfz(ppc_avr_t *r, ppc_avr_t *b, uint32_t ps)
{
    int i;
    int cr = 0;
    int invalid = 0;
    int zone_digit = 0;
    int zone_lead = ps ? 0xF : 0x3;
    int digit = 0;
    ppc_avr_t ret = { .u64 = { 0, 0 } };
    int sgnb = b->VsrB(BCD_DIG_BYTE(0)) >> 4;

    if (unlikely((sgnb < 0xA) && ps)) {
        invalid = 1;
    }

    for (i = 0; i < 16; i++) {
        zone_digit = i ? b->VsrB(BCD_DIG_BYTE(i * 2)) >> 4 : zone_lead;
        digit = b->VsrB(BCD_DIG_BYTE(i * 2)) & 0xF;
        if (unlikely(zone_digit != zone_lead || digit > 0x9)) {
            invalid = 1;
            break;
        }

        bcd_put_digit(&ret, digit, i + 1);
    }

    if ((ps && (sgnb == 0xB || sgnb == 0xD)) ||
            (!ps && (sgnb & 0x4))) {
        bcd_put_digit(&ret, BCD_NEG_PREF, 0);
    } else {
        bcd_put_digit(&ret, BCD_PLUS_PREF_1, 0);
    }

    cr = bcd_cmp_zero(&ret);

    if (unlikely(invalid)) {
        cr = CRF_SO;
    }

    *r = ret;

    return cr;
}